

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool Fossilize::merge_concurrent_databases
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  unsigned_long uVar1;
  pointer __n;
  pointer __n_00;
  bool bVar2;
  uint uVar3;
  DatabaseInterface *pDVar4;
  pointer pDVar5;
  reference puVar6;
  uchar *puVar7;
  size_type sVar8;
  allocator<unsigned_char> local_c9;
  undefined1 local_c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  size_t blob_size;
  unsigned_long *hash;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t hash_count;
  ResourceTag tag;
  uint i;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  source_db;
  char *path;
  size_t source;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  local_38;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  append_db;
  bool skip_missing_inputs_local;
  size_t num_source_paths_local;
  char **source_paths_local;
  char *append_archive_local;
  
  append_db._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl._7_1_ =
       skip_missing_inputs;
  pDVar4 = create_stream_archive_database(append_archive,Append);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&local_38,pDVar4);
  pDVar5 = std::
           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ::operator->(&local_38);
  uVar3 = (*pDVar5->_vptr_DatabaseInterface[2])();
  if ((uVar3 & 1) == 0) {
    append_archive_local._7_1_ = 0;
  }
  else {
    for (path = (char *)0x0; path < num_source_paths; path = path + 1) {
      source_db._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           *(__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
             *)&((__uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  *)(source_paths + (long)path))->_M_t;
      pDVar4 = create_stream_archive_database
                         ((char *)source_db._M_t.
                                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                                  _M_head_impl,ReadOnly);
      std::
      unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
      unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
                ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
                  *)&tag,pDVar4);
      pDVar5 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)&tag);
      uVar3 = (*pDVar5->_vptr_DatabaseInterface[2])();
      if ((uVar3 & 1) == 0) {
        if ((append_db._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl._7_1_ & 1)
            == 0) {
          append_archive_local._7_1_ = 0;
          source._4_4_ = 1;
        }
        else {
          fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",
                  source_db._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl);
          source._4_4_ = 4;
        }
      }
      else {
        for (hash_count._4_4_ = 0; hash_count._4_4_ < 10; hash_count._4_4_ = hash_count._4_4_ + 1) {
          hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pDVar5 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                 *)&tag);
          uVar3 = (*pDVar5->_vptr_DatabaseInterface[6])
                            (pDVar5,(ulong)hash_count._4_4_,
                             &hashes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
          __n_00 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if ((uVar3 & 1) == 0) {
            append_archive_local._7_1_ = 0;
            source._4_4_ = 1;
            goto LAB_001c1e93;
          }
          std::allocator<unsigned_long>::allocator
                    ((allocator<unsigned_long> *)((long)&__range3 + 7));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,
                     (size_type)__n_00,(allocator_type *)((long)&__range3 + 7));
          std::allocator<unsigned_long>::~allocator
                    ((allocator<unsigned_long> *)((long)&__range3 + 7));
          pDVar5 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                 *)&tag);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
          uVar3 = (*pDVar5->_vptr_DatabaseInterface[6])
                            (pDVar5,(ulong)hash_count._4_4_,
                             &hashes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((uVar3 & 1) == 0) {
            append_archive_local._7_1_ = 0;
            source._4_4_ = 1;
          }
          else {
            __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
            hash = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                               *)&hash), bVar2) {
              puVar6 = __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator*(&__end3);
              blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pDVar5 = std::
                       unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                     *)&tag);
              uVar3 = (*pDVar5->_vptr_DatabaseInterface[3])
                                (pDVar5,(ulong)hash_count._4_4_,*puVar6,
                                 &blob.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
              __n = blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
              if ((uVar3 & 1) == 0) {
                append_archive_local._7_1_ = 0;
                source._4_4_ = 1;
                goto LAB_001c1e6a;
              }
              std::allocator<unsigned_char>::allocator(&local_c9);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
                         (size_type)__n,&local_c9);
              std::allocator<unsigned_char>::~allocator(&local_c9);
              pDVar5 = std::
                       unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                     *)&tag);
              uVar1 = *puVar6;
              puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8)
              ;
              uVar3 = (*pDVar5->_vptr_DatabaseInterface[3])
                                (pDVar5,(ulong)hash_count._4_4_,uVar1,
                                 &blob.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,puVar7,1);
              if ((uVar3 & 1) == 0) {
                append_archive_local._7_1_ = 0;
                source._4_4_ = 1;
              }
              else {
                pDVar5 = std::
                         unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ::operator->(&local_38);
                uVar1 = *puVar6;
                puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_c8);
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8
                                  );
                uVar3 = (*pDVar5->_vptr_DatabaseInterface[4])
                                  (pDVar5,(ulong)hash_count._4_4_,uVar1,puVar7,sVar8,1);
                if ((uVar3 & 1) == 0) {
                  append_archive_local._7_1_ = 0;
                  source._4_4_ = 1;
                }
                else {
                  source._4_4_ = 0;
                }
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
              if (source._4_4_ != 0) goto LAB_001c1e6a;
              __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&__end3);
            }
            source._4_4_ = 0;
          }
LAB_001c1e6a:
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
          if (source._4_4_ != 0) goto LAB_001c1e93;
        }
        source._4_4_ = 0;
      }
LAB_001c1e93:
      std::
      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
      ~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   *)&tag);
      if ((source._4_4_ != 0) && (source._4_4_ != 4)) goto LAB_001c1ed6;
    }
    append_archive_local._7_1_ = 1;
  }
LAB_001c1ed6:
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&local_38);
  return (bool)(append_archive_local._7_1_ & 1);
}

Assistant:

bool merge_concurrent_databases(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                bool skip_missing_inputs)
{
	auto append_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::Append));
	if (!append_db->prepare())
		return false;

	for (size_t source = 0; source < num_source_paths; source++)
	{
		const char *path = source_paths[source];
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (!skip_missing_inputs)
				return false;

			LOGW("Archive %s could not be prepared, skipping.\n", path);
			continue;
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t blob_size = 0;
				if (!source_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;
				std::vector<uint8_t> blob(blob_size);
				if (!source_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;

				if (!append_db->write_entry(tag, hash, blob.data(), blob.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
					return false;
			}
		}
	}

	return true;
}